

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall QByteArray::append(QByteArray *this,QByteArray *ba)

{
  long lVar1;
  bool bVar2;
  QByteArrayView data;
  
  bVar2 = isNull(ba);
  if (!bVar2) {
    bVar2 = isNull(this);
    if (bVar2) {
      if ((ba->d).d == (Data *)0x0) {
        append();
      }
      else {
        QArrayDataPointer<char>::operator=(&this->d,&ba->d);
      }
    }
    else {
      lVar1 = (ba->d).size;
      if (lVar1 != 0) {
        data.m_data = (ba->d).ptr;
        data.m_size = lVar1;
        insert(this,(this->d).size,data);
      }
    }
  }
  return this;
}

Assistant:

QByteArray &QByteArray::append(const QByteArray &ba)
{
    if (!ba.isNull()) {
        if (isNull()) {
            if (Q_UNLIKELY(!ba.d.isMutable()))
                assign(ba); // fromRawData, so we do a deep copy
            else
                operator=(ba);
        } else if (ba.size()) {
            append(QByteArrayView(ba));
        }
    }
    return *this;
}